

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

RTQuaternion __thiscall RTMatrix4x4::operator*(RTMatrix4x4 *this,RTQuaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  RTQuaternion RVar5;
  RTQuaternion local_28;
  
  RTQuaternion::RTQuaternion(&local_28);
  fVar1 = q->m_data[0];
  fVar2 = q->m_data[1];
  fVar3 = q->m_data[2];
  fVar4 = q->m_data[3];
  RVar5.m_data[0] =
       fVar4 * (float)*(undefined8 *)(this->m_data[0] + 3) +
       fVar3 * (float)*(undefined8 *)(this->m_data[0] + 2) +
       fVar1 * (float)*(undefined8 *)this->m_data[0] +
       (float)*(undefined8 *)(this->m_data[0] + 1) * fVar2;
  RVar5.m_data[1] =
       fVar4 * this->m_data[1][3] +
       fVar3 * this->m_data[1][2] + fVar1 * this->m_data[1][0] + this->m_data[1][1] * fVar2;
  RVar5.m_data[2] =
       fVar4 * this->m_data[2][3] +
       fVar3 * this->m_data[2][2] + fVar1 * this->m_data[2][0] + this->m_data[2][1] * fVar2;
  RVar5.m_data[3] =
       fVar4 * this->m_data[3][3] +
       fVar3 * this->m_data[3][2] + fVar1 * this->m_data[3][0] + this->m_data[3][1] * fVar2;
  return (RTQuaternion)RVar5.m_data;
}

Assistant:

const RTQuaternion RTMatrix4x4::operator *(const RTQuaternion& q) const
{
    RTQuaternion res;

    res.setScalar(m_data[0][0] * q.scalar() + m_data[0][1] * q.x() + m_data[0][2] * q.y() + m_data[0][3] * q.z());
    res.setX(m_data[1][0] * q.scalar() + m_data[1][1] * q.x() + m_data[1][2] * q.y() + m_data[1][3] * q.z());
    res.setY(m_data[2][0] * q.scalar() + m_data[2][1] * q.x() + m_data[2][2] * q.y() + m_data[2][3] * q.z());
    res.setZ(m_data[3][0] * q.scalar() + m_data[3][1] * q.x() + m_data[3][2] * q.y() + m_data[3][3] * q.z());

    return res;
}